

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::normalize_space(char_t *buffer)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  char_t *write;
  byte *pbVar4;
  
  bVar3 = *buffer;
  pbVar1 = (byte *)buffer;
  pbVar2 = (byte *)buffer;
  if (bVar3 != 0) {
    do {
      if (((anonymous_namespace)::chartype_table[bVar3] & 8) == 0) {
        pbVar1 = pbVar1 + 1;
LAB_00123edd:
        *pbVar2 = bVar3;
        pbVar4 = pbVar2 + 1;
      }
      else {
        do {
          pbVar4 = pbVar1 + 1;
          pbVar1 = pbVar1 + 1;
        } while (((anonymous_namespace)::chartype_table[*pbVar4] & 8) != 0);
        bVar3 = 0x20;
        pbVar4 = (byte *)buffer;
        if (pbVar2 != (byte *)buffer) goto LAB_00123edd;
      }
      bVar3 = *pbVar1;
      pbVar2 = pbVar4;
    } while (bVar3 != 0);
    if ((pbVar4 != (byte *)buffer) &&
       (buffer = (char_t *)(pbVar4 + -1),
       ((anonymous_namespace)::chartype_table[pbVar4[-1]] & 8) == 0)) {
      buffer = (char_t *)pbVar4;
    }
  }
  *buffer = 0;
  return buffer;
}

Assistant:

PUGI__FN char_t* normalize_space(char_t* buffer)
	{
		char_t* write = buffer;

		for (char_t* it = buffer; *it; )
		{
			char_t ch = *it++;

			if (PUGI__IS_CHARTYPE(ch, ct_space))
			{
				// replace whitespace sequence with single space
				while (PUGI__IS_CHARTYPE(*it, ct_space)) it++;

				// avoid leading spaces
				if (write != buffer) *write++ = ' ';
			}
			else *write++ = ch;
		}

		// remove trailing space
		if (write != buffer && PUGI__IS_CHARTYPE(write[-1], ct_space)) write--;

		// zero-terminate
		*write = 0;

		return write;
	}